

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  ulong uVar1;
  DescriptorStringView this_00;
  unsigned_long x;
  char *in_RCX;
  string_view input;
  AlphaNum local_158;
  AlphaNum local_128;
  AlphaNum local_f8;
  undefined1 local_c8 [16];
  string local_b8;
  AlphaNum local_98;
  AlphaNum local_68;
  allocator<char> local_21;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  FieldDescriptor::default_value_string_abi_cxx11_(descriptor);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    absl::lts_20240722::AlphaNum::AlphaNum
              (&local_68,
               "global::System.Text.Encoding.UTF8.GetString(global::System.Convert.FromBase64String(\""
              );
    this_00 = FieldDescriptor::default_value_string_abi_cxx11_(local_20);
    local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    input._M_len = local_c8._8_8_;
    input._M_str = in_RCX;
    StringToBase64_abi_cxx11_(&local_b8,local_c8._0_8_,input);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_98,&local_b8);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_f8,"\"), 0, ");
    FieldDescriptor::default_value_string_abi_cxx11_(local_20);
    x = std::__cxx11::string::length();
    absl::lts_20240722::AlphaNum::AlphaNum(&local_128,x);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_158,")");
    absl::lts_20240722::StrCat<>
              (__return_storage_ptr__,&local_68,&local_98,&local_f8,&local_128,&local_158);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"\"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    return absl::StrCat(
        "global::System.Text.Encoding.UTF8.GetString(global::System."
        "Convert.FromBase64String(\"",
        StringToBase64(descriptor->default_value_string()), "\"), 0, ",
        descriptor->default_value_string().length(), ")");
}